

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_257ea0::Av1Config_GetAv1ConfigFromAnnexBObu_Test::TestBody
          (Av1Config_GetAv1ConfigFromAnnexBObu_Test *this)

{
  undefined8 *puVar1;
  char *in_R9;
  AssertHelper AStack_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  internal local_38 [8];
  undefined8 *local_30;
  string local_28;
  
  local_38[0] = (internal)VerifyAv1c((anonymous_namespace)::kAnnexBFullSequenceHeaderObu,0xd,true);
  local_30 = (undefined8 *)0x0;
  if ((bool)local_38[0]) {
    local_38[0] = (internal)
                  VerifyAv1c((anonymous_namespace)::kAnnexBReducedStillImageSequenceHeaderObu,9,true
                            );
    local_30 = (undefined8 *)0x0;
    if ((bool)local_38[0]) {
      return;
    }
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,
               (AssertionResult *)
               "VerifyAv1c(kAnnexBReducedStillImageSequenceHeaderObu, sizeof(kAnnexBReducedStillImageSequenceHeaderObu), true)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
               ,0x85,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
  }
  else {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,
               (AssertionResult *)
               "VerifyAv1c(kAnnexBFullSequenceHeaderObu, sizeof(kAnnexBFullSequenceHeaderObu), true)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
               ,0x80,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  if (local_40._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  puVar1 = local_30;
  if (local_30 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_30 != local_30 + 2) {
      operator_delete((undefined8 *)*local_30);
    }
    operator_delete(puVar1);
  }
  return;
}

Assistant:

TEST(Av1Config, GetAv1ConfigFromAnnexBObu) {
  // Test parsing of a Sequence Header OBU with the reduced_still_picture_header
  // unset-- aka a full Sequence Header OBU.
  ASSERT_TRUE(VerifyAv1c(kAnnexBFullSequenceHeaderObu,
                         sizeof(kAnnexBFullSequenceHeaderObu), true));

  // Test parsing of a reduced still image Sequence Header OBU.
  ASSERT_TRUE(VerifyAv1c(kAnnexBReducedStillImageSequenceHeaderObu,
                         sizeof(kAnnexBReducedStillImageSequenceHeaderObu),
                         true));
}